

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O0

Aig_Man_t *
Saig_ManPhaseAbstract
          (Aig_Man_t *p,Vec_Int_t *vInits,int nFrames,int nPref,int fIgnore,int fPrint,int fVerbose)

{
  int iVar1;
  Saig_Tsim_t *p_00;
  uint *pState;
  Saig_Tsim_t *pTsi;
  Aig_Man_t *pNew;
  int fPrint_local;
  int fIgnore_local;
  int nPref_local;
  int nFrames_local;
  Vec_Int_t *vInits_local;
  Aig_Man_t *p_local;
  
  pTsi = (Saig_Tsim_t *)0x0;
  iVar1 = Saig_ManRegNum(p);
  if (iVar1 == 0) {
    __assert_fail("Saig_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                  ,0x393,
                  "Aig_Man_t *Saig_ManPhaseAbstract(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int)"
                 );
  }
  iVar1 = Saig_ManPiNum(p);
  if (iVar1 == 0) {
    __assert_fail("Saig_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                  ,0x394,
                  "Aig_Man_t *Saig_ManPhaseAbstract(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int)"
                 );
  }
  iVar1 = Saig_ManPoNum(p);
  if (iVar1 == 0) {
    __assert_fail("Saig_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                  ,0x395,
                  "Aig_Man_t *Saig_ManPhaseAbstract(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int)"
                 );
  }
  p_00 = Saig_ManReachableTernary(p,vInits,fVerbose);
  if (p_00 == (Saig_Tsim_t *)0x0) {
    p_local = (Aig_Man_t *)0x0;
  }
  else {
    pState = (uint *)Vec_PtrEntryLast(p_00->vStates);
    iVar1 = Saig_TsiComputePrefix(p_00,pState,p_00->nWords);
    p_00->nPrefix = iVar1;
    iVar1 = Vec_PtrSize(p_00->vStates);
    p_00->nCycle = (iVar1 + -1) - p_00->nPrefix;
    iVar1 = Abc_MinInt(p_00->nPrefix,nPref);
    iVar1 = Saig_TsiCountNonXValuedRegisters(p_00,iVar1);
    p_00->nNonXRegs = iVar1;
    if (((fVerbose != 0) &&
        (printf("Lead = %5d. Loop = %5d.  Total flops = %5d. Binary flops = %5d.\n",
                (ulong)(uint)p_00->nPrefix,(ulong)(uint)p_00->nCycle,(ulong)(uint)p->nRegs,
                (ulong)(uint)p_00->nNonXRegs), p_00->nNonXRegs < 100)) &&
       (iVar1 = Vec_PtrSize(p_00->vStates), iVar1 < 0x50)) {
      Saig_TsiPrintTraces(p_00,p_00->nWords,p_00->nPrefix,p_00->nCycle);
    }
    if (fPrint == 0) {
      if (nFrames < 2) {
        printf("The number of frames is less than 2. Phase assignment is not performed.\n");
      }
      else if (nFrames < 0x101) {
        if (p_00->nCycle == 1) {
          printf("The cycle of ternary states is trivial. Phase abstraction cannot be done.\n");
        }
        else if (p_00->nCycle % nFrames == 0) {
          if (p_00->nNonXRegs == 0) {
            printf("All registers have X-valued states. Phase abstraction cannot be done.\n");
          }
          else {
            iVar1 = Saig_ManFindRegisters(p_00,nFrames,fIgnore,fVerbose);
            if (iVar1 == 0) {
              printf("There is no registers to abstract with %d frames.\n",(ulong)(uint)nFrames);
            }
            else {
              pTsi = (Saig_Tsim_t *)Saig_ManPerformAbstraction(p_00,nFrames,fVerbose);
            }
          }
        }
        else {
          printf("The cycle (%d) is not modulo the number of frames (%d). Phase abstraction cannot be done.\n"
                 ,(ulong)(uint)p_00->nCycle,(ulong)(uint)nFrames);
        }
      }
      else {
        printf("The number of frames is more than 256. Phase assignment is not performed.\n");
      }
    }
    else {
      printf("Print-out finished. Phase assignment is not performed.\n");
    }
    Saig_TsiStop(p_00);
    p_local = (Aig_Man_t *)pTsi;
  }
  return p_local;
}

Assistant:

Aig_Man_t * Saig_ManPhaseAbstract( Aig_Man_t * p, Vec_Int_t * vInits, int nFrames, int nPref, int fIgnore, int fPrint, int fVerbose )
{
    Aig_Man_t * pNew = NULL;
    Saig_Tsim_t * pTsi;
    assert( Saig_ManRegNum(p) );
    assert( Saig_ManPiNum(p) );
    assert( Saig_ManPoNum(p) );
    // perform terminary simulation
    pTsi = Saig_ManReachableTernary( p, vInits, fVerbose );
    if ( pTsi == NULL )
        return NULL;
    // derive information
    pTsi->nPrefix = Saig_TsiComputePrefix( pTsi, (unsigned *)Vec_PtrEntryLast(pTsi->vStates), pTsi->nWords );
    pTsi->nCycle = Vec_PtrSize(pTsi->vStates) - 1 - pTsi->nPrefix;
    pTsi->nNonXRegs = Saig_TsiCountNonXValuedRegisters(pTsi, Abc_MinInt(pTsi->nPrefix,nPref));
    // print statistics
    if ( fVerbose )
    {
        printf( "Lead = %5d. Loop = %5d.  Total flops = %5d. Binary flops = %5d.\n", 
            pTsi->nPrefix, pTsi->nCycle, p->nRegs, pTsi->nNonXRegs );
        if ( pTsi->nNonXRegs < 100 && Vec_PtrSize(pTsi->vStates) < 80 )
            Saig_TsiPrintTraces( pTsi, pTsi->nWords, pTsi->nPrefix, pTsi->nCycle );
    }
    if ( fPrint )
        printf( "Print-out finished. Phase assignment is not performed.\n" );
    else if ( nFrames < 2 )
        printf( "The number of frames is less than 2. Phase assignment is not performed.\n" );
    else if ( nFrames > 256 )
        printf( "The number of frames is more than 256. Phase assignment is not performed.\n" );
    else if ( pTsi->nCycle == 1 )
        printf( "The cycle of ternary states is trivial. Phase abstraction cannot be done.\n" );
    else if ( pTsi->nCycle % nFrames != 0 )
        printf( "The cycle (%d) is not modulo the number of frames (%d). Phase abstraction cannot be done.\n", pTsi->nCycle, nFrames );
    else if ( pTsi->nNonXRegs == 0 )
        printf( "All registers have X-valued states. Phase abstraction cannot be done.\n" );
    else if ( !Saig_ManFindRegisters( pTsi, nFrames, fIgnore, fVerbose ) )
        printf( "There is no registers to abstract with %d frames.\n", nFrames );
    else
        pNew = Saig_ManPerformAbstraction( pTsi, nFrames, fVerbose );
    Saig_TsiStop( pTsi );
    return pNew;
}